

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseSyntaxIdentifier(Parser *this,LocationRecorder *parent)

{
  bool bVar1;
  Token *pTVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string syntax;
  Token syntax_token;
  undefined1 local_38 [8];
  LocationRecorder syntax_location;
  LocationRecorder *parent_local;
  Parser *this_local;
  
  syntax_location.location_ = (Location *)parent;
  LocationRecorder::LocationRecorder((LocationRecorder *)local_38,parent,0xc);
  bVar1 = Consume(this,"syntax",
                  "File must begin with a syntax statement, e.g. \'syntax = \"proto2\";\'.");
  if (bVar1) {
    bVar1 = Consume(this,"=");
    if (bVar1) {
      pTVar2 = io::Tokenizer::current(this->input_);
      io::Tokenizer::Token::Token((Token *)((long)&syntax.field_2 + 8),pTVar2);
      std::__cxx11::string::string((string *)local_a0);
      bVar1 = ConsumeString(this,(string *)local_a0,"Expected syntax identifier.");
      if (bVar1) {
        bVar1 = ConsumeEndOfDeclaration(this,";",(LocationRecorder *)local_38);
        if (bVar1) {
          std::__cxx11::string::operator=((string *)&this->syntax_identifier_,(string *)local_a0);
          bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_a0,"proto2");
          if (((bVar1) &&
              (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_a0,"proto3"), bVar1)) &&
             ((this->stop_after_syntax_identifier_ & 1U) == 0)) {
            std::operator+(&local_e0,"Unrecognized syntax identifier \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_a0);
            std::operator+(&local_c0,&local_e0,
                           "\".  This parser only recognizes \"proto2\" and \"proto3\".");
            AddError(this,syntax_token.text.field_2._8_4_,syntax_token.text.field_2._12_4_,&local_c0
                    );
            std::__cxx11::string::~string((string *)&local_c0);
            std::__cxx11::string::~string((string *)&local_e0);
            this_local._7_1_ = false;
          }
          else {
            this_local._7_1_ = true;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
      std::__cxx11::string::~string((string *)local_a0);
      io::Tokenizer::Token::~Token((Token *)((long)&syntax.field_2 + 8));
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  LocationRecorder::~LocationRecorder((LocationRecorder *)local_38);
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseSyntaxIdentifier(const LocationRecorder& parent) {
  LocationRecorder syntax_location(parent,
                                   FileDescriptorProto::kSyntaxFieldNumber);
  DO(Consume(
      "syntax",
      "File must begin with a syntax statement, e.g. 'syntax = \"proto2\";'."));
  DO(Consume("="));
  io::Tokenizer::Token syntax_token = input_->current();
  std::string syntax;
  DO(ConsumeString(&syntax, "Expected syntax identifier."));
  DO(ConsumeEndOfDeclaration(";", &syntax_location));

  syntax_identifier_ = syntax;

  if (syntax != "proto2" && syntax != "proto3" &&
      !stop_after_syntax_identifier_) {
    AddError(syntax_token.line, syntax_token.column,
             "Unrecognized syntax identifier \"" + syntax +
                 "\".  This parser "
                 "only recognizes \"proto2\" and \"proto3\".");
    return false;
  }

  return true;
}